

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

void arena_i_decay(tsdn_t *tsdn,uint arena_ind,_Bool all)

{
  long lVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  arena_t *paVar5;
  undefined1 ***apppuStack_40 [2];
  
  apppuStack_40[0] = (undefined1 ***)0xe598d0;
  malloc_mutex_lock(tsdn,&ctl_mtx);
  if (ctl_arenas->narenas == arena_ind || arena_ind == 0x1000) {
    uVar4 = (ulong)ctl_arenas->narenas;
    lVar1 = -(uVar4 * 8 + 0xf & 0xfffffffffffffff0);
    apppuStack_40[1] = (undefined1 ***)(apppuStack_40 + 1);
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      pvVar3 = duckdb_je_arenas[uVar2].repr;
      if (pvVar3 == (void *)0x0) {
        pvVar3 = (void *)0x0;
      }
      *(void **)((long)apppuStack_40 + uVar2 * 8 + lVar1 + -0x38 + 0x40) = pvVar3;
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    *(undefined8 *)((long)apppuStack_40 + lVar1) = 0xe59993;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      paVar5 = *(arena_t **)((long)apppuStack_40 + uVar2 * 8 + lVar1 + -0x38 + 0x40);
      if (paVar5 != (arena_t *)0x0) {
        *(undefined8 *)((long)apppuStack_40 + lVar1) = 0xe599b6;
        duckdb_je_arena_decay(tsdn,paVar5,false,all);
      }
    }
  }
  else {
    paVar5 = (arena_t *)duckdb_je_arenas[arena_ind].repr;
    if (paVar5 == (arena_t *)0x0) {
      paVar5 = (arena_t *)0x0;
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    apppuStack_40[0] = (undefined1 ***)0xe5995c;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    if (paVar5 != (arena_t *)0x0) {
      duckdb_je_arena_decay(tsdn,paVar5,false,all);
      return;
    }
  }
  return;
}

Assistant:

static void
arena_i_decay(tsdn_t *tsdn, unsigned arena_ind, bool all) {
	malloc_mutex_lock(tsdn, &ctl_mtx);
	{
		unsigned narenas = ctl_arenas->narenas;

		/*
		 * Access via index narenas is deprecated, and scheduled for
		 * removal in 6.0.0.
		 */
		if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind == narenas) {
			unsigned i;
			VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

			for (i = 0; i < narenas; i++) {
				tarenas[i] = arena_get(tsdn, i, false);
			}

			/*
			 * No further need to hold ctl_mtx, since narenas and
			 * tarenas contain everything needed below.
			 */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			for (i = 0; i < narenas; i++) {
				if (tarenas[i] != NULL) {
					arena_decay(tsdn, tarenas[i], false,
					    all);
				}
			}
		} else {
			arena_t *tarena;

			assert(arena_ind < narenas);

			tarena = arena_get(tsdn, arena_ind, false);

			/* No further need to hold ctl_mtx. */
			malloc_mutex_unlock(tsdn, &ctl_mtx);

			if (tarena != NULL) {
				arena_decay(tsdn, tarena, false, all);
			}
		}
	}
}